

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O0

double hdr_stddev(hdr_histogram *h)

{
  _Bool _Var1;
  int64_t iVar2;
  double dVar3;
  double dev;
  hdr_iter iter;
  double geometric_dev_total;
  double mean;
  hdr_histogram *h_local;
  
  dVar3 = hdr_mean(h);
  iter._next_fp = (_func__Bool_hdr_iter_ptr *)0x0;
  hdr_iter_init((hdr_iter *)&dev,h);
  while (_Var1 = hdr_iter_next((hdr_iter *)&dev), _Var1) {
    if (iter.total_count != 0) {
      iVar2 = hdr_median_equivalent_value(h,iter.cumulative_count);
      iter._next_fp =
           (_func__Bool_hdr_iter_ptr *)
           (((double)iVar2 + -dVar3) * ((double)iVar2 + -dVar3) * (double)iter.total_count +
           (double)iter._next_fp);
    }
  }
  dVar3 = sqrt((double)iter._next_fp / (double)h->total_count);
  return dVar3;
}

Assistant:

double hdr_stddev(const struct hdr_histogram* h)
{
    double mean = hdr_mean(h);
    double geometric_dev_total = 0.0;

    struct hdr_iter iter;
    hdr_iter_init(&iter, h);

    while (hdr_iter_next(&iter))
    {
        if (0 != iter.count)
        {
            double dev = (hdr_median_equivalent_value(h, iter.value) * 1.0) - mean;
            geometric_dev_total += (dev * dev) * iter.count;
        }
    }

    return sqrt(geometric_dev_total / h->total_count);
}